

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsOptions.cpp
# Opt level: O2

OptionStatus checkOption(HighsLogOptions *report_log_options,OptionRecordInt *option)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  pointer pcVar4;
  char *format;
  
  uVar1 = option->lower_bound;
  uVar2 = option->upper_bound;
  if ((int)uVar2 < (int)uVar1) {
    pcVar4 = (option->super_OptionRecord).name._M_dataplus._M_p;
    format = "checkOption: Option \"%s\" has inconsistent bounds [%d, %d]\n";
    uVar3 = uVar1;
    uVar1 = uVar2;
  }
  else {
    uVar3 = option->default_value;
    if ((int)uVar3 < (int)uVar1 || (int)uVar2 < (int)uVar3) {
      pcVar4 = (option->super_OptionRecord).name._M_dataplus._M_p;
      format = "checkOption: Option \"%s\" has default value %d inconsistent with bounds [%d, %d]\n"
      ;
    }
    else {
      uVar3 = *option->value;
      if ((int)uVar1 <= (int)uVar3 && (int)uVar3 <= (int)uVar2) {
        return kOk;
      }
      pcVar4 = (option->super_OptionRecord).name._M_dataplus._M_p;
      format = "checkOption: Option \"%s\" has value %d inconsistent with bounds [%d, %d]\n";
    }
  }
  highsLogUser(report_log_options,kError,format,pcVar4,(ulong)uVar3,(ulong)uVar1);
  return kIllegalValue;
}

Assistant:

OptionStatus checkOption(const HighsLogOptions& report_log_options,
                         const OptionRecordInt& option) {
  if (option.lower_bound > option.upper_bound) {
    highsLogUser(
        report_log_options, HighsLogType::kError,
        "checkOption: Option \"%s\" has inconsistent bounds [%" HIGHSINT_FORMAT
        ", %" HIGHSINT_FORMAT "]\n",
        option.name.c_str(), option.lower_bound, option.upper_bound);
    return OptionStatus::kIllegalValue;
  }
  if (option.default_value < option.lower_bound ||
      option.default_value > option.upper_bound) {
    highsLogUser(
        report_log_options, HighsLogType::kError,
        "checkOption: Option \"%s\" has default value %" HIGHSINT_FORMAT
        " "
        "inconsistent with bounds [%" HIGHSINT_FORMAT ", %" HIGHSINT_FORMAT
        "]\n",
        option.name.c_str(), option.default_value, option.lower_bound,
        option.upper_bound);
    return OptionStatus::kIllegalValue;
  }
  HighsInt value = *option.value;
  if (value < option.lower_bound || value > option.upper_bound) {
    highsLogUser(report_log_options, HighsLogType::kError,
                 "checkOption: Option \"%s\" has value %" HIGHSINT_FORMAT
                 " inconsistent with "
                 "bounds [%" HIGHSINT_FORMAT ", %" HIGHSINT_FORMAT "]\n",
                 option.name.c_str(), value, option.lower_bound,
                 option.upper_bound);
    return OptionStatus::kIllegalValue;
  }
  return OptionStatus::kOk;
}